

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.h
# Opt level: O2

void __thiscall cfd::core::ScriptOperator::~ScriptOperator(ScriptOperator *this)

{
  ~ScriptOperator(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~ScriptOperator() {
    // do nothing
  }